

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_r6_muldiv(DisasContext_conflict6 *ctx,int opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i64 t2_13;
  TCGv_i64 t2_12;
  TCGv_i64 t3_11;
  TCGv_i64 t2_11;
  TCGv_i64 t3_10;
  TCGv_i64 t2_10;
  TCGv_i64 t3_9;
  TCGv_i64 t2_9;
  TCGv_i64 t3_8;
  TCGv_i64 t2_8;
  TCGv_i32 t3_7;
  TCGv_i32 t2_7;
  TCGv_i32 t3_6;
  TCGv_i32 t2_6;
  TCGv_i32 t3_5;
  TCGv_i32 t2_5;
  TCGv_i32 t3_4;
  TCGv_i32 t2_4;
  TCGv_i64 t3_3;
  TCGv_i64 t2_3;
  TCGv_i64 t3_2;
  TCGv_i64 t2_2;
  TCGv_i64 t3_1;
  TCGv_i64 t2_1;
  TCGv_i64 t3;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int rt_local;
  int rs_local;
  int rd_local;
  int opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (rd != 0) {
    t = tcg_temp_new_i64(tcg_ctx_00);
    t_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t,rs);
    gen_load_gpr(tcg_ctx_00,t_00,rt);
    switch(opc) {
    case 0x98:
      pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
      pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar1,t);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar2,t_00);
      tcg_gen_mul_i32(tcg_ctx_00,pTVar1,pTVar1,pTVar2);
      tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],pTVar1);
      tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      break;
    case 0x99:
      pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
      pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar1,t);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar2,t_00);
      tcg_gen_mul_i32(tcg_ctx_00,pTVar1,pTVar1,pTVar2);
      tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],pTVar1);
      tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      break;
    case 0x9a:
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,t,t);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,t_00,t_00);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar3,t,-0x80000000);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,-1);
      tcg_gen_and_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,0);
      tcg_gen_or_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,pTVar4,0);
      tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,t_00,pTVar3,pTVar4,pTVar3,t_00);
      tcg_gen_div_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    case 0x9b:
      pTVar3 = tcg_const_i64_mips64el(tcg_ctx_00,0);
      pTVar4 = tcg_const_i64_mips64el(tcg_ctx_00,1);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t,t);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t_00,t_00);
      tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,t_00,t_00,pTVar3,pTVar4,t_00);
      tcg_gen_divu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    case 0x9c:
      tcg_gen_mul_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      break;
    case 0x9d:
      tcg_gen_mul_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      break;
    case 0x9e:
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar3,t,-0x8000000000000000);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,-1);
      tcg_gen_and_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,0);
      tcg_gen_or_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,pTVar4,0);
      tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,t_00,pTVar3,pTVar4,pTVar3,t_00);
      tcg_gen_div_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    case 0x9f:
      pTVar3 = tcg_const_i64_mips64el(tcg_ctx_00,0);
      pTVar4 = tcg_const_i64_mips64el(tcg_ctx_00,1);
      tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,t_00,t_00,pTVar3,pTVar4,t_00);
      tcg_gen_divu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    default:
      generate_exception_end(ctx,0x14);
      break;
    case 0xd8:
      pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
      pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar1,t);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar2,t_00);
      tcg_gen_muls2_i32_mips64el(tcg_ctx_00,pTVar1,pTVar2,pTVar1,pTVar2);
      tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],pTVar2);
      tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      break;
    case 0xd9:
      pTVar1 = tcg_temp_new_i32(tcg_ctx_00);
      pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar1,t);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx_00,pTVar2,t_00);
      tcg_gen_mulu2_i32_mips64el(tcg_ctx_00,pTVar1,pTVar2,pTVar1,pTVar2);
      tcg_gen_ext_i32_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],pTVar2);
      tcg_temp_free_i32(tcg_ctx_00,pTVar1);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      break;
    case 0xda:
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,t,t);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,t_00,t_00);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar3,t,-0x80000000);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,-1);
      tcg_gen_and_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,0);
      tcg_gen_or_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,pTVar4,0);
      tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,t_00,pTVar3,pTVar4,pTVar3,t_00);
      tcg_gen_rem_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    case 0xdb:
      pTVar3 = tcg_const_i64_mips64el(tcg_ctx_00,0);
      pTVar4 = tcg_const_i64_mips64el(tcg_ctx_00,1);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t,t);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t_00,t_00);
      tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,t_00,t_00,pTVar3,pTVar4,t_00);
      tcg_gen_remu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    case 0xdc:
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_muls2_i64_mips64el(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    case 0xdd:
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_mulu2_i64_mips64el(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    case 0xde:
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      pTVar4 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar3,t,-0x8000000000000000);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,-1);
      tcg_gen_and_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,pTVar4,t_00,0);
      tcg_gen_or_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,pTVar4);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,pTVar4,0);
      tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_NE,t_00,pTVar3,pTVar4,pTVar3,t_00);
      tcg_gen_rem_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      break;
    case 0xdf:
      pTVar3 = tcg_const_i64_mips64el(tcg_ctx_00,0);
      pTVar4 = tcg_const_i64_mips64el(tcg_ctx_00,1);
      tcg_gen_movcond_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,t_00,t_00,pTVar3,pTVar4,t_00);
      tcg_gen_remu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t,t_00);
      tcg_temp_free_i64(tcg_ctx_00,pTVar4);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
    }
    tcg_temp_free_i64(tcg_ctx_00,t);
    tcg_temp_free_i64(tcg_ctx_00,t_00);
  }
  return;
}

Assistant:

static void gen_r6_muldiv(DisasContext *ctx, int opc, int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    switch (opc) {
    case R6_OPC_DIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_MOD:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_MODU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_MUL:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mul_i32(tcg_ctx, t2, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case R6_OPC_MUH:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_muls2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case R6_OPC_MULU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mul_i32(tcg_ctx, t2, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case R6_OPC_MUHU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mulu2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
#if defined(TARGET_MIPS64)
    case R6_OPC_DDIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, -1LL << 63);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1LL);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMOD:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, -1LL << 63);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1LL);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DDIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMODU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_remu_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMUL:
        tcg_gen_mul_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case R6_OPC_DMUH:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            tcg_gen_muls2_i64(tcg_ctx, t2, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMULU:
        tcg_gen_mul_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case R6_OPC_DMUHU:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            tcg_gen_mulu2_i64(tcg_ctx, t2, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
#endif
    default:
        MIPS_INVAL("r6 mul/div");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
 out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}